

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O2

void __thiscall
icu_63::RuleBasedTimeZone::getOffsetInternal
          (RuleBasedTimeZone *this,UDate date,UBool local,int32_t NonExistingTimeOpt,
          int32_t DuplicatedTimeOpt,int32_t *rawOffset,int32_t *dstOffset,UErrorCode *status)

{
  int32_t iVar1;
  Transition *pTVar2;
  TimeZoneRule *this_00;
  void *pvVar3;
  InitialTimeZoneRule **ppIVar4;
  UDate UVar5;
  
  *rawOffset = 0;
  *dstOffset = 0;
  if (U_ZERO_ERROR < *status) {
    return;
  }
  if (this->fUpToDate == '\0') {
    *status = U_INVALID_STATE_ERROR;
    return;
  }
  if (this->fHistoricTransitions == (UVector *)0x0) {
LAB_00203213:
    ppIVar4 = &this->fInitialRule;
  }
  else {
    pTVar2 = (Transition *)UVector::elementAt(this->fHistoricTransitions,0);
    UVar5 = getTransitionTime(this,pTVar2,local,NonExistingTimeOpt,DuplicatedTimeOpt);
    if (date < UVar5) goto LAB_00203213;
    iVar1 = this->fHistoricTransitions->count + -1;
    pTVar2 = (Transition *)UVector::elementAt(this->fHistoricTransitions,iVar1);
    UVar5 = getTransitionTime(this,pTVar2,local,NonExistingTimeOpt,DuplicatedTimeOpt);
    if (date <= UVar5) {
      for (; -1 < iVar1; iVar1 = iVar1 + -1) {
        pTVar2 = (Transition *)UVector::elementAt(this->fHistoricTransitions,iVar1);
        UVar5 = getTransitionTime(this,pTVar2,local,NonExistingTimeOpt,DuplicatedTimeOpt);
        if (UVar5 <= date) break;
      }
    }
    else if ((this->fFinalRules != (UVector *)0x0) &&
            (this_00 = findRuleInFinal(this,date,local,NonExistingTimeOpt,DuplicatedTimeOpt),
            this_00 != (TimeZoneRule *)0x0)) goto LAB_0020329f;
    pvVar3 = UVector::elementAt(this->fHistoricTransitions,iVar1);
    ppIVar4 = (InitialTimeZoneRule **)((long)pvVar3 + 0x10);
  }
  this_00 = &(*ppIVar4)->super_TimeZoneRule;
  if (this_00 == (TimeZoneRule *)0x0) {
    return;
  }
LAB_0020329f:
  iVar1 = TimeZoneRule::getRawOffset(this_00);
  *rawOffset = iVar1;
  iVar1 = TimeZoneRule::getDSTSavings(this_00);
  *dstOffset = iVar1;
  return;
}

Assistant:

void
RuleBasedTimeZone::getOffsetInternal(UDate date, UBool local,
                                     int32_t NonExistingTimeOpt, int32_t DuplicatedTimeOpt,
                                     int32_t& rawOffset, int32_t& dstOffset,
                                     UErrorCode& status) const {
    rawOffset = 0;
    dstOffset = 0;

    if (U_FAILURE(status)) {
        return;
    }
    if (!fUpToDate) {
        // Transitions are not yet resolved.  We cannot do it here
        // because this method is const.  Thus, do nothing and return
        // error status.
        status = U_INVALID_STATE_ERROR;
        return;
    }
    const TimeZoneRule *rule = NULL;
    if (fHistoricTransitions == NULL) {
        rule = fInitialRule;
    } else {
        UDate tstart = getTransitionTime((Transition*)fHistoricTransitions->elementAt(0),
            local, NonExistingTimeOpt, DuplicatedTimeOpt);
        if (date < tstart) {
            rule = fInitialRule;
        } else {
            int32_t idx = fHistoricTransitions->size() - 1;
            UDate tend = getTransitionTime((Transition*)fHistoricTransitions->elementAt(idx),
                local, NonExistingTimeOpt, DuplicatedTimeOpt);
            if (date > tend) {
                if (fFinalRules != NULL) {
                    rule = findRuleInFinal(date, local, NonExistingTimeOpt, DuplicatedTimeOpt);
                }
                if (rule == NULL) {
                    // no final rules or the given time is before the first transition
                    // specified by the final rules -> use the last rule 
                    rule = ((Transition*)fHistoricTransitions->elementAt(idx))->to;
                }
            } else {
                // Find a historical transition
                while (idx >= 0) {
                    if (date >= getTransitionTime((Transition*)fHistoricTransitions->elementAt(idx),
                        local, NonExistingTimeOpt, DuplicatedTimeOpt)) {
                        break;
                    }
                    idx--;
                }
                rule = ((Transition*)fHistoricTransitions->elementAt(idx))->to;
            }
        }
    }
    if (rule != NULL) {
        rawOffset = rule->getRawOffset();
        dstOffset = rule->getDSTSavings();
    }
}